

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr_ipp.hpp
# Opt level: O2

shared_ptr<duckdb::DatabaseCacheEntry,_true> __thiscall
duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>::lock
          (weak_ptr<duckdb::DatabaseCacheEntry,_true> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> sVar1;
  __shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ::std::__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20);
  ::std::__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  sVar1.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::DatabaseCacheEntry,_true>)
         sVar1.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T, SAFE> lock() const { // NOLINT: invalid case style
		return shared_ptr<T, SAFE>(internal.lock());
	}